

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindTwoUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vUnateLitsW,int fVerbose)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  char *pOff;
  uint uVar4;
  ulong uVar5;
  int nPairs;
  uint local_4c;
  Vec_Ptr_t *local_48;
  Vec_Int_t **local_40;
  Vec_Int_t **local_38;
  
  pOff = (char *)pSets;
  local_48 = vDivs;
  local_40 = vUnateLits;
  local_38 = vUnateLitsW;
  if (fVerbose != 0) {
    pOff = "  ";
    printf("  ");
  }
  uVar4 = 0;
  uVar5 = 0;
  bVar3 = true;
  while( true ) {
    uVar2 = Gia_ManFindTwoUnateInt
                      ((word *)pOff,pSets[uVar5 ^ 1],local_48,nWords,local_40[uVar5],local_38[uVar5]
                       ,(int *)&local_4c);
    if (fVerbose != 0) {
      pOff = "UU%d =%5d ";
      printf("UU%d =%5d ",uVar5,(ulong)local_4c);
    }
    if (-1 < (int)uVar2) break;
    uVar5 = 1;
    uVar4 = 1;
    bVar1 = !bVar3;
    bVar3 = false;
    if (bVar1) {
      return -1;
    }
  }
  return uVar2 ^ uVar4;
}

Assistant:

int Gia_ManFindTwoUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vUnateLitsW[2], int fVerbose )
{
    int n, iLit, nPairs;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        //int nPairsAll = Vec_IntSize(vUnateLits[n])*(Vec_IntSize(vUnateLits[n])-1)/2;
        iLit = Gia_ManFindTwoUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vUnateLitsW[n], &nPairs );
        if ( fVerbose ) printf( "UU%d =%5d ", n, nPairs );
        if ( iLit >= 0 )
            return Abc_LitNotCond(iLit, n);
    }
    return -1;
}